

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::ROR_AB(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint8_t cr;
  uint8_t data;
  uint8_t addr;
  CPU *this_local;
  
  this->cycles = 6;
  uVar3 = GetWord(this);
  bVar1 = ReadByte(this,uVar3 & 0xff);
  bVar2 = 0;
  if (((this->field_6).ps & 1) != 0) {
    bVar2 = 0x80;
  }
  (this->field_6).ps = (this->field_6).ps & 0xfe | ((bVar1 & 1) != 0 && -1 < (int)(bVar1 & 1));
  bVar1 = (byte)((int)(uint)bVar1 >> 1) | bVar2;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (bVar1 == 0) << 1;
  (this->field_6).ps = (this->field_6).ps & 0x7f | (bVar2 != 0 && -1 < (int)(bVar1 & 0x80)) << 7;
  WriteByte(this,uVar3 & 0xff,bVar1);
  return;
}

Assistant:

void CPU::ROR_AB()
{
    cycles = 6;
    uint8_t addr = GetWord();
    uint8_t data = ReadByte(addr);
    uint8_t cr = C ? 0b10000000 : 0;
    C = (data & 0b00000001) > 0;
    data >>= 1;
    data |= cr;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}